

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.hpp
# Opt level: O3

bool __thiscall helics::NamedPoint::operator==(NamedPoint *this,NamedPoint *np)

{
  double dVar1;
  double dVar2;
  size_t __n;
  int iVar3;
  
  dVar1 = this->value;
  dVar2 = np->value;
  if ((((NAN(dVar1)) && (NAN(dVar2))) || ((dVar1 == dVar2 && (!NAN(dVar1) && !NAN(dVar2))))) &&
     (__n = (this->name)._M_string_length, __n == (np->name)._M_string_length)) {
    if (__n != 0) {
      iVar3 = bcmp((this->name)._M_dataplus._M_p,(np->name)._M_dataplus._M_p,__n);
      return iVar3 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const NamedPoint& np) const
    {
        return ((std::isnan(value)) && (std::isnan(np.value))) ?
            (name == np.name) :
            ((value == np.value) && (name == np.name));
    }